

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

int Abc_ObjSugraphSize(Abc_Obj_t *pObj)

{
  int *piVar1;
  void **ppvVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = 0;
  while (((uVar3 = *(uint *)&pObj->field_0x14 & 0xf, uVar3 != 2 && (uVar3 != 5)) &&
         ((pObj->vFanouts).nSize < 2))) {
    piVar1 = (pObj->vFanins).pArray;
    ppvVar2 = pObj->pNtk->vObjs->pArray;
    iVar4 = Abc_ObjSugraphSize((Abc_Obj_t *)ppvVar2[*piVar1]);
    iVar5 = iVar5 + iVar4 + 1;
    pObj = (Abc_Obj_t *)ppvVar2[piVar1[1]];
  }
  return iVar5;
}

Assistant:

int Abc_ObjSugraphSize( Abc_Obj_t * pObj )
{
    if ( Abc_ObjIsCi(pObj) )
        return 0;
    if ( Abc_ObjFanoutNum(pObj) > 1 )
        return 0;
    return 1 + Abc_ObjSugraphSize(Abc_ObjFanin0(pObj)) + 
        Abc_ObjSugraphSize(Abc_ObjFanin1(pObj));
}